

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O3

uint16_t bitset_container_maximum(bitset_container_t *container)

{
  ulong uVar1;
  long lVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  
  sVar3 = -1;
  uVar5 = 0x400;
  do {
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
    uVar1 = container->words[uVar5];
    if (uVar1 != 0) {
      lVar2 = 0x3f;
      if (uVar1 != 0) {
        for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      return sVar3 - ((ushort)lVar2 ^ 0x3f);
    }
    sVar3 = sVar3 + -0x40;
  } while (1 < uVar4);
  return 0;
}

Assistant:

uint16_t bitset_container_maximum(const bitset_container_t *container) {
  for (int32_t i = BITSET_CONTAINER_SIZE_IN_WORDS - 1; i > 0; --i ) {
    uint64_t w = container->words[i];
    if (w != 0) {
      int r = roaring_leading_zeroes(w);
      return i * 64 + 63  - r;
    }
  }
  return 0;
}